

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainwindow.cpp
# Opt level: O2

void __thiscall
FSSMainWindow::onCurrentChanged(FSSMainWindow *this,QModelIndex *current,QModelIndex *param_2)

{
  uint _t2;
  Resource _t1;
  QModelIndex local_30;
  
  QModelIndex::parent(&local_30,current);
  if (((local_30.r < 0) || (local_30.c < 0)) || (local_30.m == (QAbstractItemModel *)0x0)) {
    _t1 = AssetNone;
    _t2 = 0;
  }
  else {
    QModelIndex::parent(&local_30,current);
    _t1 = local_30.r + AssetArtLandscape;
    _t2 = current->r;
  }
  resourceSelected(this,_t1,_t2);
  return;
}

Assistant:

void
FSSMainWindow::onCurrentChanged(const QModelIndex &current,
                                const QModelIndex & /*previous*/) {
  Data::Resource resource_class = Data::AssetNone;
  unsigned int index = 0;

  if (current.parent().isValid()) {
    resource_class = (Data::Resource)(current.parent().row() + 1);
    index = current.row();
  }

  emit resourceSelected(resource_class, index);
}